

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall
pybind11::detail::values_and_holders::iterator::iterator
          (iterator *this,instance *inst,type_vec *tinfo)

{
  pointer pptVar1;
  type_info *ptVar2;
  anon_union_24_2_63b86169_for_instance_1 *paVar3;
  
  this->inst = inst;
  this->types = tinfo;
  pptVar1 = (tinfo->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pptVar1 ==
      (tinfo->
      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    ptVar2 = (type_info *)0x0;
  }
  else {
    ptVar2 = *pptVar1;
  }
  (this->curr).inst = inst;
  (this->curr).index = 0;
  (this->curr).type = ptVar2;
  paVar3 = &inst->field_1;
  if ((inst->field_0x30 & 2) == 0) {
    paVar3 = (anon_union_24_2_63b86169_for_instance_1 *)paVar3->simple_value_holder[0];
  }
  (this->curr).vh = (void **)paVar3;
  return;
}

Assistant:

iterator(instance *inst, const type_vec *tinfo)
            : inst{inst}, types{tinfo},
            curr(inst /* instance */,
                 types->empty() ? nullptr : (*types)[0] /* type info */,
                 0, /* vpos: (non-simple types only): the first vptr comes first */
                 0 /* index */)
        {}